

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

reference __thiscall
llvm::SmallVectorImpl<llvm::StringRef>::emplace_back<char_const(&)[22]>
          (SmallVectorImpl<llvm::StringRef> *this,char (*Args) [22])

{
  void *pvVar1;
  uint uVar2;
  size_t sVar3;
  uint uVar4;
  long lVar5;
  
  uVar4 = (this->super_SmallVectorTemplateBase<llvm::StringRef,_true>).
          super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size;
  uVar2 = (this->super_SmallVectorTemplateBase<llvm::StringRef,_true>).
          super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Capacity;
  if (uVar2 <= uVar4) {
    SmallVectorBase::grow_pod((SmallVectorBase *)this,this + 1,0,0x10);
    uVar4 = (this->super_SmallVectorTemplateBase<llvm::StringRef,_true>).
            super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size;
    uVar2 = (this->super_SmallVectorTemplateBase<llvm::StringRef,_true>).
            super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Capacity;
  }
  pvVar1 = (this->super_SmallVectorTemplateBase<llvm::StringRef,_true>).
           super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX;
  lVar5 = (ulong)uVar4 * 0x10;
  *(char (**) [22])((long)pvVar1 + lVar5) = Args;
  sVar3 = strlen(*Args);
  *(size_t *)((long)pvVar1 + lVar5 + 8) = sVar3;
  if (uVar4 < uVar2) {
    (this->super_SmallVectorTemplateBase<llvm::StringRef,_true>).
    super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size = uVar4 + 1;
    return (reference)((ulong)uVar4 * 0x10 + (long)pvVar1);
  }
  __assert_fail("N <= capacity()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/include/llvm/ADT/SmallVector.h"
                ,0x43,"void llvm::SmallVectorBase::set_size(size_t)");
}

Assistant:

reference emplace_back(ArgTypes &&... Args) {
    if (LLVM_UNLIKELY(this->size() >= this->capacity()))
      this->grow();
    ::new ((void *)this->end()) T(std::forward<ArgTypes>(Args)...);
    this->set_size(this->size() + 1);
    return this->back();
  }